

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cast.cpp
# Opt level: O0

void TestNumericCast<float,signed_char>
               (vector<float,_true> *working_values,vector<float,_true> *broken_values)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  bool bVar1;
  undefined1 uVar2;
  ExprLhs<const_signed_char_&> this;
  reference pfVar3;
  undefined8 in_RSI;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  float value_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<float,_true> *__range1_1;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  float value;
  iterator __end0;
  iterator __begin0;
  vector<float,_true> *__range1;
  char result;
  undefined4 in_stack_fffffffffffffc88;
  Flags in_stack_fffffffffffffc8c;
  undefined7 in_stack_fffffffffffffc90;
  ExprLhs<bool> in_stack_fffffffffffffc97;
  SourceLineInfo *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  char *in_stack_fffffffffffffca8;
  SourceLineInfo *this_00;
  size_type in_stack_fffffffffffffcb0;
  undefined1 *puVar4;
  undefined6 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbe;
  char in_stack_fffffffffffffcbf;
  AssertionHandler *in_stack_fffffffffffffcc0;
  SourceLineInfo local_2f8;
  StringRef local_2e8;
  SourceLineInfo local_280;
  StringRef local_270;
  undefined1 local_260 [76];
  float local_214;
  float *local_210;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_208;
  undefined8 local_200;
  char local_1f2;
  char *local_1f0;
  AssertionHandler local_1a8;
  undefined1 local_139;
  SourceLineInfo local_128;
  StringRef local_118;
  SourceLineInfo local_a0;
  StringRef local_90;
  float local_34;
  float *local_30;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_28 [2];
  signed local_11;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_28[0]._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_30 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90),
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (!bVar1) break;
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(local_28);
    local_34 = *pfVar3;
    local_90 = operator____catch_sr
                         ((char *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90
                                          ),
                          CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/common/test_cast.cpp"
               ,0x25);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (char *)in_stack_fffffffffffffc98);
    capturedExpression.m_size = in_stack_fffffffffffffcb0;
    capturedExpression.m_start = in_stack_fffffffffffffca8;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (StringRef *)in_stack_fffffffffffffc98,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90)
               ,capturedExpression,in_stack_fffffffffffffc8c);
    duckdb::Cast::Operation<float,signed_char>((float)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    Catch::AssertionHandler::handleExceptionNotThrownAsExpected((AssertionHandler *)0x6de899);
    Catch::AssertionHandler::complete
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    local_118 = operator____catch_sr
                          ((char *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,
                                            in_stack_fffffffffffffc90),
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/common/test_cast.cpp"
               ,0x26);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (char *)in_stack_fffffffffffffc98);
    capturedExpression_00.m_size = in_stack_fffffffffffffcb0;
    capturedExpression_00.m_start = in_stack_fffffffffffffca8;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (StringRef *)in_stack_fffffffffffffc98,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90)
               ,capturedExpression_00,in_stack_fffffffffffffc8c);
    duckdb::TryCast::Operation<float,signed_char>(local_34,&local_11,false);
    local_139 = Catch::Decomposer::operator<=
                          ((Decomposer *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),false);
    Catch::AssertionHandler::handleExpr<bool>
              (in_stack_fffffffffffffcc0,
               (ExprLhs<bool> *)
               CONCAT17(in_stack_fffffffffffffcbf,
                        CONCAT16(in_stack_fffffffffffffcbe,in_stack_fffffffffffffcb8)));
    Catch::AssertionHandler::complete
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    local_1a8.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90),
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffcc0 = &local_1a8;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffcc0,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/common/test_cast.cpp"
               ,0x27);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (char *)in_stack_fffffffffffffc98);
    capturedExpression_01.m_size = in_stack_fffffffffffffcb0;
    capturedExpression_01.m_start = in_stack_fffffffffffffca8;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (StringRef *)in_stack_fffffffffffffc98,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90)
               ,capturedExpression_01,in_stack_fffffffffffffc8c);
    this = Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                      (char *)0x6deb0a);
    local_1f0 = this.m_lhs;
    in_stack_fffffffffffffcbf = ExpectedNumericCast<float,_signed_char>::Operation(0.0);
    local_1f2 = in_stack_fffffffffffffcbf;
    Catch::ExprLhs<signed_char_const&>::operator==
              ((ExprLhs<const_signed_char_&> *)this.m_lhs,(char *)in_stack_fffffffffffffcc0);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90),
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
              );
    Catch::BinaryExpr<const_signed_char_&,_const_signed_char_&>::~BinaryExpr
              ((BinaryExpr<const_signed_char_&,_const_signed_char_&> *)0x6deb80);
    Catch::AssertionHandler::complete
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (local_28);
  }
  local_200 = local_10;
  local_208._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_210 = (float *)std::vector<float,_std::allocator<float>_>::end
                                 ((vector<float,_std::allocator<float>_> *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90),
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (!bVar1) break;
    pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_208);
    local_214 = *pfVar3;
    local_270 = operator____catch_sr
                          ((char *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,
                                            in_stack_fffffffffffffc90),
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    this_00 = &local_280;
    Catch::SourceLineInfo::SourceLineInfo
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/common/test_cast.cpp"
               ,0x2a);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (char *)in_stack_fffffffffffffc98);
    puVar4 = local_260;
    capturedExpression_02.m_size = (size_type)puVar4;
    capturedExpression_02.m_start = (char *)this_00;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (StringRef *)in_stack_fffffffffffffc98,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90)
               ,capturedExpression_02,in_stack_fffffffffffffc8c);
    uVar2 = Catch::AssertionHandler::allowThrows((AssertionHandler *)0x6ded9f);
    if ((bool)uVar2) {
      duckdb::Cast::Operation<float,signed_char>((float)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
      Catch::AssertionHandler::handleUnexpectedExceptionNotThrown((AssertionHandler *)0x6dedcf);
    }
    else {
      Catch::AssertionHandler::handleThrowingCallSkipped((AssertionHandler *)0x6dee54);
    }
    Catch::AssertionHandler::complete
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    local_2e8 = operator____catch_sr
                          ((char *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,
                                            in_stack_fffffffffffffc90),
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffc98 = &local_2f8;
    Catch::SourceLineInfo::SourceLineInfo
              (in_stack_fffffffffffffc98,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/common/test_cast.cpp"
               ,0x2b);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (char *)in_stack_fffffffffffffc98);
    capturedExpression_03.m_size = (size_type)puVar4;
    capturedExpression_03.m_start = (char *)this_00;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
               (StringRef *)in_stack_fffffffffffffc98,
               (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90)
               ,capturedExpression_03,in_stack_fffffffffffffc8c);
    in_stack_fffffffffffffca7 =
         duckdb::TryCast::Operation<float,signed_char>(local_214,&local_11,false);
    in_stack_fffffffffffffc97 =
         Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                    false);
    Catch::AssertionHandler::handleExpr<bool>
              (in_stack_fffffffffffffcc0,
               (ExprLhs<bool> *)
               CONCAT17(in_stack_fffffffffffffcbf,CONCAT16(uVar2,in_stack_fffffffffffffcb8)));
    Catch::AssertionHandler::complete
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)
               CONCAT17(in_stack_fffffffffffffc97.m_lhs,in_stack_fffffffffffffc90));
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_208);
  }
  return;
}

Assistant:

static void TestNumericCast(duckdb::vector<SRC> &working_values, duckdb::vector<SRC> &broken_values) {
	DST result;
	for (auto value : working_values) {
		REQUIRE_NOTHROW(Cast::Operation<SRC, DST>(value) == (DST)value);
		REQUIRE(TryCast::Operation<SRC, DST>(value, result));
		REQUIRE(result == ExpectedNumericCast<SRC, DST>::Operation(value));
	}
	for (auto value : broken_values) {
		REQUIRE_THROWS(Cast::Operation<SRC, DST>(value));
		REQUIRE(!TryCast::Operation<SRC, DST>(value, result));
	}
}